

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::LoadableGetStateBlock_x
          (ChElementBeamANCF_3333 *this,int block_offset,ChState *mD)

{
  double *pdVar1;
  pointer psVar2;
  double *pdVar3;
  element_type *peVar4;
  long lVar5;
  Index index_8;
  Index index_6;
  Index index;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (block_offset < 0) goto LAB_00726349;
  lVar5 = (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  if (lVar5 < block_offset) goto LAB_00726349;
  psVar2 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  peVar4 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pdVar1 = pdVar3 + block_offset;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00725f85;
  }
  else {
LAB_00725f85:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  uVar6 = (ulong)(uint)block_offset;
  if (lVar5 < (long)(uVar6 + 3)) goto LAB_00726349;
  pdVar1 = pdVar3 + uVar6 + 3;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00725ff4;
  }
  else {
LAB_00725ff4:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 6)) goto LAB_00726349;
  pdVar1 = pdVar3 + uVar6 + 6;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00726067;
  }
  else {
LAB_00726067:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->DD_dt + uVar9 * 8 + 0xffffffffffffffe8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 9)) goto LAB_00726349;
  peVar4 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 9;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_007260de;
  }
  else {
LAB_007260de:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0xc)) goto LAB_00726349;
  pdVar1 = pdVar3 + uVar6 + 0xc;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0072614b;
  }
  else {
LAB_0072614b:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0xf)) goto LAB_00726349;
  pdVar1 = pdVar3 + uVar6 + 0xf;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_007261be;
  }
  else {
LAB_007261be:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->DD_dt + uVar9 * 8 + 0xffffffffffffffe8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x12)) goto LAB_00726349;
  peVar4 = psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 0x12;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00726238;
  }
  else {
LAB_00726238:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x15)) goto LAB_00726349;
  pdVar1 = pdVar3 + uVar6 + 0x15;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_007262a8;
  }
  else {
LAB_007262a8:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x18)) {
LAB_00726349:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar3 = pdVar3 + uVar6 + 0x18;
  uVar6 = 3;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 == 0) goto LAB_0072632a;
  }
  uVar8 = 0;
  do {
    pdVar3[uVar8] = *(double *)((long)&peVar4->DD_dt + uVar8 * 8 + 0xffffffffffffffe8);
    uVar8 = uVar8 + 1;
  } while (uVar6 != uVar8);
LAB_0072632a:
  if (uVar6 < 3) {
    do {
      pdVar3[uVar6] = *(double *)((long)&peVar4->DD_dt + uVar6 * 8 + 0xffffffffffffffe8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  return;
}

Assistant:

void ChElementBeamANCF_3333::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 3) = m_nodes[0]->GetD().eigen();
    mD.segment(block_offset + 6, 3) = m_nodes[0]->GetDD().eigen();

    mD.segment(block_offset + 9, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 12, 3) = m_nodes[1]->GetD().eigen();
    mD.segment(block_offset + 15, 3) = m_nodes[1]->GetDD().eigen();

    mD.segment(block_offset + 18, 3) = m_nodes[2]->GetPos().eigen();
    mD.segment(block_offset + 21, 3) = m_nodes[2]->GetD().eigen();
    mD.segment(block_offset + 24, 3) = m_nodes[2]->GetDD().eigen();
}